

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O2

void __thiscall chrono::fea::ChMesh::VariablesFbReset(ChMesh *this)

{
  pointer psVar1;
  element_type *peVar2;
  long lVar3;
  uint uVar4;
  
  uVar4 = 0;
  while( true ) {
    psVar1 = (this->vnodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->vnodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)uVar4) break;
    peVar2 = psVar1[uVar4].
             super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar3 = *(long *)((long)peVar2->_vptr_ChNodeFEAbase + -0x18);
    (**(code **)(*(long *)((long)&peVar2->_vptr_ChNodeFEAbase + lVar3) + 0x78))
              ((long)&peVar2->_vptr_ChNodeFEAbase + lVar3);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void ChMesh::VariablesFbReset() {
    for (unsigned int ie = 0; ie < vnodes.size(); ie++)
        vnodes[ie]->VariablesFbReset();
}